

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall State::State(State *this,int w,int h,int *numbers)

{
  int **ppiVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)w;
  this->width = w;
  this->height = h;
  this->size = h * w;
  this->previous = (State *)0x0;
  uVar4 = (ulong)(uint)h << 3;
  if (h < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppiVar1 = (int **)operator_new__(uVar4);
  this->tiles = ppiVar1;
  if (0 < h) {
    lVar5 = 0;
    do {
      iVar6 = (int)uVar7;
      uVar4 = (long)iVar6 * 4;
      if (iVar6 < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      piVar2 = (int *)operator_new__(uVar4);
      this->tiles[lVar5] = piVar2;
      if (0 < iVar6) {
        piVar2 = this->tiles[lVar5];
        lVar3 = 0;
        do {
          iVar6 = numbers[(int)uVar7 * (int)lVar5 + lVar3];
          piVar2[lVar3] = iVar6;
          if (iVar6 == 0) {
            (this->blank).height = (int)lVar5;
            (this->blank).width = (int)lVar3;
          }
          lVar3 = lVar3 + 1;
          uVar7 = (ulong)this->width;
        } while (lVar3 < (long)uVar7);
        h = this->height;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < h);
  }
  return;
}

Assistant:

State::State(int w, int h, int* numbers) {
    width = w;
    height = h;
    size = w * h;
    previous = nullptr;

    tiles = new int *[height];
    for (int i = 0; i < height; i++) {
        tiles[i] = new int[width];

        for (int j = 0; j < width; j++) {
            tiles[i][j] = numbers[i * width + j];

            if (tiles[i][j] == 0) {
                blank.height = i;
                blank.width = j;
            }
        }
    }
}